

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O0

void __thiscall QGraphicsScene::focusInEvent(QGraphicsScene *this,QFocusEvent *focusEvent)

{
  int iVar1;
  uint uVar2;
  QGraphicsScenePrivate *pQVar3;
  QEvent *in_RSI;
  QGraphicsItem *in_RDI;
  QGraphicsScenePrivate *d;
  FocusReason focusReason;
  undefined4 in_stack_ffffffffffffffe0;
  
  pQVar3 = d_func((QGraphicsScene *)0x9d22f1);
  *(uint *)&pQVar3->field_0xb8 = *(uint *)&pQVar3->field_0xb8 | 0x400;
  iVar1 = QFocusEvent::reason();
  if (iVar1 == 1) {
    uVar2 = (*in_RDI->_vptr_QGraphicsItem[0x20])(in_RDI,1);
    if ((uVar2 & 1) == 0) {
      QEvent::ignore(in_RSI);
    }
  }
  else if (iVar1 == 2) {
    uVar2 = (*in_RDI->_vptr_QGraphicsItem[0x20])(in_RDI,0);
    if ((uVar2 & 1) == 0) {
      QEvent::ignore(in_RSI);
    }
  }
  else if (pQVar3->passiveFocusItem != (QGraphicsItem *)0x0) {
    focusReason = (FocusReason)((ulong)pQVar3->passiveFocusItem >> 0x20);
    QFocusEvent::reason();
    setFocusItem((QGraphicsScene *)CONCAT44(iVar1,in_stack_ffffffffffffffe0),in_RDI,focusReason);
  }
  return;
}

Assistant:

void QGraphicsScene::focusInEvent(QFocusEvent *focusEvent)
{
    Q_D(QGraphicsScene);

    d->hasFocus = true;
    switch (focusEvent->reason()) {
    case Qt::TabFocusReason:
        if (!focusNextPrevChild(true))
            focusEvent->ignore();
        break;
    case Qt::BacktabFocusReason:
        if (!focusNextPrevChild(false))
            focusEvent->ignore();
        break;
    default:
        if (d->passiveFocusItem) {
            // Set focus on the last focus item
            setFocusItem(d->passiveFocusItem, focusEvent->reason());
        }
        break;
    }
}